

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

bool __thiscall wasm::LocalGraph::isSSA(LocalGraph *this,Index x)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var3 = &(this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4]) {
    bVar4 = p_Var2[1]._M_color < x;
    if (!bVar4) {
      p_Var1 = p_Var2;
    }
  }
  p_Var2 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, x < p_Var1[1]._M_color)) {
    p_Var2 = &p_Var3->_M_header;
  }
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool LocalGraph::isSSA(Index x) { return SSAIndexes.count(x); }